

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cameras.cpp
# Opt level: O2

void pbrt::RealisticCamera::ComputeCardinalPoints(Ray *rIn,Ray *rOut,Float *pz,Float *fz)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 in_register_00001244 [12];
  Point3f PVar6;
  
  auVar5._8_4_ = 0x80000000;
  auVar5._0_8_ = 0x8000000080000000;
  auVar5._12_4_ = 0x80000000;
  auVar5 = vxorps_avx512vl(ZEXT416((uint)(rOut->o).super_Tuple3<pbrt::Point3,_float>.x),auVar5);
  PVar6 = Ray::operator()(rOut,auVar5._0_4_ / (rOut->d).super_Tuple3<pbrt::Vector3,_float>.x);
  auVar1._8_4_ = 0x80000000;
  auVar1._0_8_ = 0x8000000080000000;
  auVar1._12_4_ = 0x80000000;
  auVar3._4_12_ = in_register_00001244;
  auVar3._0_4_ = PVar6.super_Tuple3<pbrt::Point3,_float>.z;
  auVar5 = vxorps_avx512vl(auVar3,auVar1);
  *fz = auVar5._0_4_;
  PVar6 = Ray::operator()(rOut,((rIn->o).super_Tuple3<pbrt::Point3,_float>.x -
                               (rOut->o).super_Tuple3<pbrt::Point3,_float>.x) /
                               (rOut->d).super_Tuple3<pbrt::Vector3,_float>.x);
  auVar2._8_4_ = 0x80000000;
  auVar2._0_8_ = 0x8000000080000000;
  auVar2._12_4_ = 0x80000000;
  auVar4._4_12_ = in_register_00001244;
  auVar4._0_4_ = PVar6.super_Tuple3<pbrt::Point3,_float>.z;
  auVar5 = vxorps_avx512vl(auVar4,auVar2);
  *pz = auVar5._0_4_;
  return;
}

Assistant:

void RealisticCamera::ComputeCardinalPoints(const Ray &rIn, const Ray &rOut, Float *pz,
                                            Float *fz) {
    Float tf = -rOut.o.x / rOut.d.x;
    *fz = -rOut(tf).z;
    Float tp = (rIn.o.x - rOut.o.x) / rOut.d.x;
    *pz = -rOut(tp).z;
}